

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateFrameworkMethods
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  mapped_type *this_00;
  FieldDescriptor *pFVar4;
  FieldGeneratorBase *pFVar5;
  OneofDescriptor *pOVar6;
  string *psVar7;
  string local_108;
  int local_e4;
  int i_3;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> generator_1;
  undefined1 local_d0 [4];
  int i_2;
  int local_ac;
  int i_1;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> generator;
  int i;
  string local_68;
  undefined1 local_48 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_48);
  class_name_abi_cxx11_(&local_68,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"class_name",(allocator *)((long)&generator.ptr_ + 7));
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_48,(key_type *)&i);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_68);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&generator.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_68);
  SourceGeneratorBase::WriteGeneratedCodeAttributes
            (&this->super_SourceGeneratorBase,
             (Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_48,
                     "public override bool Equals(object other) {\n  return Equals(other as $class_name$);\n}\n\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes
            (&this->super_SourceGeneratorBase,
             (Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_48,
                     "public bool Equals($class_name$ other) {\n  if (ReferenceEquals(other, null)) {\n    return false;\n  }\n  if (ReferenceEquals(other, this)) {\n    return true;\n  }\n"
                    );
  io::Printer::Indent((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  generator.ptr_._0_4_ = 0;
  while( true ) {
    iVar1 = (int)generator.ptr_;
    iVar3 = Descriptor::field_count(this->descriptor_);
    if (iVar3 <= iVar1) break;
    pFVar4 = Descriptor::field(this->descriptor_,(int)generator.ptr_);
    pFVar5 = CreateFieldGeneratorInternal(this,pFVar4);
    internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::scoped_ptr
              ((scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> *)
               &stack0xffffffffffffff58,pFVar5);
    pFVar5 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
             operator->((scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> *)
                        &stack0xffffffffffffff58);
    (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xb])
              (pFVar5,vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::~scoped_ptr
              ((scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> *)
               &stack0xffffffffffffff58);
    generator.ptr_._0_4_ = (int)generator.ptr_ + 1;
  }
  local_ac = 0;
  while( true ) {
    iVar1 = local_ac;
    iVar3 = Descriptor::oneof_decl_count(this->descriptor_);
    sVar2 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (iVar3 <= iVar1) break;
    pOVar6 = Descriptor::oneof_decl(this->descriptor_,local_ac);
    psVar7 = OneofDescriptor::name_abi_cxx11_(pOVar6);
    UnderscoresToCamelCase((string *)local_d0,psVar7,true);
    io::Printer::Print((Printer *)sVar2,
                       "if ($property_name$Case != other.$property_name$Case) return false;\n",
                       "property_name",(string *)local_d0);
    std::__cxx11::string::~string((string *)local_d0);
    local_ac = local_ac + 1;
  }
  io::Printer::Outdent((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     "  return true;\n}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes
            (&this->super_SourceGeneratorBase,
             (Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     "public override int GetHashCode() {\n  int hash = 1;\n");
  io::Printer::Indent((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  generator_1.ptr_._4_4_ = 0;
  while( true ) {
    iVar1 = generator_1.ptr_._4_4_;
    iVar3 = Descriptor::field_count(this->descriptor_);
    if (iVar3 <= iVar1) break;
    pFVar4 = Descriptor::field(this->descriptor_,generator_1.ptr_._4_4_);
    pFVar5 = CreateFieldGeneratorInternal(this,pFVar4);
    internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::scoped_ptr
              ((scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> *)
               &stack0xffffffffffffff20,pFVar5);
    pFVar5 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
             operator->((scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> *)
                        &stack0xffffffffffffff20);
    (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[10])
              (pFVar5,vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::~scoped_ptr
              ((scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> *)
               &stack0xffffffffffffff20);
    generator_1.ptr_._4_4_ = generator_1.ptr_._4_4_ + 1;
  }
  local_e4 = 0;
  while( true ) {
    iVar1 = local_e4;
    iVar3 = Descriptor::oneof_decl_count(this->descriptor_);
    sVar2 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (iVar3 <= iVar1) break;
    pOVar6 = Descriptor::oneof_decl(this->descriptor_,local_e4);
    psVar7 = OneofDescriptor::name_abi_cxx11_(pOVar6);
    UnderscoresToCamelCase(&local_108,psVar7,false);
    io::Printer::Print((Printer *)sVar2,"hash ^= (int) $name$Case_;\n","name",&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    local_e4 = local_e4 + 1;
  }
  io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     "return hash;\n");
  io::Printer::Outdent((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes
            (&this->super_SourceGeneratorBase,
             (Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     "public override string ToString() {\n  return pb::JsonFormatter.ToDiagnosticString(this);\n}\n\n"
                    );
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_48);
  return;
}

Assistant:

void MessageGenerator::GenerateFrameworkMethods(io::Printer* printer) {
    map<string, string> vars;
    vars["class_name"] = class_name();

    // Equality
	WriteGeneratedCodeAttributes(printer);
    printer->Print(
        vars,
        "public override bool Equals(object other) {\n"
        "  return Equals(other as $class_name$);\n"
        "}\n\n");
	WriteGeneratedCodeAttributes(printer);
	printer->Print(
	    vars,
        "public bool Equals($class_name$ other) {\n"
        "  if (ReferenceEquals(other, null)) {\n"
        "    return false;\n"
        "  }\n"
        "  if (ReferenceEquals(other, this)) {\n"
        "    return true;\n"
        "  }\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
        scoped_ptr<FieldGeneratorBase> generator(
            CreateFieldGeneratorInternal(descriptor_->field(i)));
        generator->WriteEquals(printer);
    }
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
        printer->Print("if ($property_name$Case != other.$property_name$Case) return false;\n",
            "property_name", UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true));
    }
    printer->Outdent();
    printer->Print(
        "  return true;\n"
        "}\n\n");

    // GetHashCode
    // Start with a non-zero value to easily distinguish between null and "empty" messages.
	WriteGeneratedCodeAttributes(printer);
	printer->Print(
        "public override int GetHashCode() {\n"
        "  int hash = 1;\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
        scoped_ptr<FieldGeneratorBase> generator(
            CreateFieldGeneratorInternal(descriptor_->field(i)));
        generator->WriteHash(printer);
    }
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
        printer->Print("hash ^= (int) $name$Case_;\n",
            "name", UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false));
    }
    printer->Print("return hash;\n");
    printer->Outdent();
    printer->Print("}\n\n");

	WriteGeneratedCodeAttributes(printer);
	printer->Print(
        "public override string ToString() {\n"
        "  return pb::JsonFormatter.ToDiagnosticString(this);\n"
        "}\n\n");
}